

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O2

bounded_buffer * peparse::makeBufferFromPointer(uint8_t *data,uint32_t sz)

{
  bounded_buffer *pbVar1;
  _func_ios_base_ptr_ios_base_ptr *f;
  _func_ios_base_ptr_ios_base_ptr *f_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  if (data == (uint8_t *)0x0) {
    err = 1;
    std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
    to_string<unsigned_int>(&local_30,0x134,f);
    std::operator+(&local_50,":",&local_30);
    std::__cxx11::string::append((string *)&err_loc_abi_cxx11_);
  }
  else {
    pbVar1 = (bounded_buffer *)operator_new(0x18,(nothrow_t *)&std::nothrow);
    if (pbVar1 != (bounded_buffer *)0x0) {
      pbVar1->buf = (uint8_t *)0x0;
      pbVar1->bufLen = 0;
      pbVar1->copy = false;
      pbVar1->swapBytes = false;
      *(undefined2 *)&pbVar1->field_0xe = 0;
      pbVar1->copy = true;
      pbVar1->detail = (buffer_detail *)0x0;
      pbVar1->buf = data;
      pbVar1->bufLen = sz;
      return pbVar1;
    }
    err = 1;
    std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
    to_string<unsigned_int>(&local_30,0x13b,f_00);
    std::operator+(&local_50,":",&local_30);
    std::__cxx11::string::append((string *)&err_loc_abi_cxx11_);
  }
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return (bounded_buffer *)0x0;
}

Assistant:

bounded_buffer *makeBufferFromPointer(std::uint8_t *data, std::uint32_t sz) {
  if (data == nullptr) {
    PE_ERR(PEERR_MEM);
    return nullptr;
  }

  bounded_buffer *p = new (std::nothrow) bounded_buffer();

  if (p == nullptr) {
    PE_ERR(PEERR_MEM);
    return nullptr;
  }

  p->copy = true;
  p->detail = nullptr;
  p->buf = data;
  p->bufLen = sz;
  p->swapBytes = false;

  return p;
}